

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxTrackBuilder.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
FluxTrackBuilder::buffer(FluxTrackBuilder *this)

{
  FluxTrackBuilder *this_local;
  
  if (this->m_flux_time != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->m_flux_times,&this->m_flux_time);
    this->m_flux_time = 0;
  }
  return &this->m_flux_times;
}

Assistant:

std::vector<uint32_t>& FluxTrackBuilder::buffer()
{
    // Flush any buffered time with a transition.
    if (m_flux_time)
    {
        m_flux_times.push_back(m_flux_time);
        m_flux_time = 0;
    }

    return m_flux_times;
}